

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

bool __thiscall
arangodb::velocypack::Builder::checkAttributeUniquenessSorted(Builder *this,Slice obj)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  Slice this_00;
  char *__s2;
  char *q;
  ValueLength len2;
  Slice current;
  char *p;
  ValueLength len;
  Slice previous;
  ObjectIterator it;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  ObjectIterator *in_stack_ffffffffffffff98;
  Slice in_stack_ffffffffffffffa0;
  ObjectIterator *in_stack_ffffffffffffffa8;
  Slice in_stack_ffffffffffffffc0;
  
  ObjectIterator::ObjectIterator
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff97);
  ObjectIterator::key(in_stack_ffffffffffffffa8,
                      SUB81((ulong)in_stack_ffffffffffffffa0._start >> 0x38,0));
  __s1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getString
                   ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                    in_stack_ffffffffffffffa0._start,(ValueLength *)in_stack_ffffffffffffff98);
  ObjectIterator::next((ObjectIterator *)in_stack_ffffffffffffffc0._start);
  while( true ) {
    this_00 = ObjectIterator::key(in_stack_ffffffffffffffa8,SUB81((ulong)__s1 >> 0x38,0));
    __s2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getStringUnchecked
                     ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                      this_00._start,
                      (ValueLength *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    if ((in_stack_ffffffffffffffa8 ==
         (ObjectIterator *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)) &&
       (iVar2 = memcmp(__s1,__s2,CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)),
       iVar2 == 0)) break;
    in_stack_ffffffffffffffa8 =
         (ObjectIterator *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90);
    ObjectIterator::next((ObjectIterator *)in_stack_ffffffffffffffc0._start);
    bVar1 = ObjectIterator::valid((ObjectIterator *)&stack0xffffffffffffffc0);
    __s1 = __s2;
    if (!bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Builder::checkAttributeUniquenessSorted(Slice obj) const {
  ObjectIterator it(obj, false);

  // fetch initial key
  Slice previous = it.key(true);
  ValueLength len;
  char const* p = previous.getString(len);

  // advance to next key already
  it.next();

  do {
    Slice const current = it.key(true);
    VELOCYPACK_ASSERT(current.isString());

    ValueLength len2;
    char const* q = current.getStringUnchecked(len2);

    if (len == len2 && std::memcmp(p, q, checkOverflow(len2)) == 0) {
      // identical key
      return false;
    }
    // re-use already calculated values for next round
    len = len2;
    p = q;
    it.next();
  } while (it.valid());

  // all keys unique
  return true;
}